

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

objc_protocol_method_description *
get_method_description(Protocol *p,SEL aSel,BOOL isRequiredMethod,BOOL isInstanceMethod)

{
  BOOL BVar1;
  long lVar2;
  undefined7 in_register_00000011;
  int iVar3;
  objc_protocol_method_description *unaff_R14;
  int *piVar4;
  
  if ((int)CONCAT71(in_register_00000011,isRequiredMethod) == 0) {
    if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
      piVar4 = (int *)0x0;
      goto LAB_00113c05;
    }
    lVar2 = (ulong)(isInstanceMethod == '\0') * 8 + 0x28;
  }
  else {
    lVar2 = (ulong)(isInstanceMethod == '\0') * 8 + 0x18;
  }
  piVar4 = *(int **)((long)&p->isa + lVar2);
LAB_00113c05:
  if ((piVar4 != (int *)0x0) && (0 < *piVar4)) {
    iVar3 = 0;
    do {
      if ((uint)piVar4[1] < 0x10) {
LAB_00113c65:
        __assert_fail("l->size >= sizeof(struct objc_protocol_method_description)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/protocol.h"
                      ,0x55,
                      "struct objc_protocol_method_description *protocol_method_at_index(struct objc_protocol_method_description_list *, int)"
                     );
      }
      BVar1 = sel_isEqual(*(SEL *)((long)piVar4 + (long)(piVar4[1] * iVar3) + 8),aSel);
      if (BVar1 != '\0') {
        if ((uint)piVar4[1] < 0x10) goto LAB_00113c65;
        unaff_R14 = (objc_protocol_method_description *)
                    ((long)piVar4 + (long)(piVar4[1] * iVar3) + 8);
      }
      if (BVar1 != '\0') {
        return unaff_R14;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < *piVar4);
  }
  return (objc_protocol_method_description *)0x0;
}

Assistant:

static struct objc_protocol_method_description *
get_method_description(Protocol *p,
                       SEL aSel,
                       BOOL isRequiredMethod,
                       BOOL isInstanceMethod)
{
	struct objc_protocol_method_description_list *list =
		get_method_list(p, isRequiredMethod, isInstanceMethod);
	if (NULL == list)
	{
		return NULL;
	}
	for (int i=0 ; i<list->count ; i++)
	{
		SEL s = protocol_method_at_index(list, i)->selector;
		if (sel_isEqual(s, aSel))
		{
			return protocol_method_at_index(list, i);
		}
	}
	return NULL;
}